

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int time_iseasterday(void)

{
  int iVar1;
  int iVar2;
  tm *ptVar3;
  int iVar4;
  long in_FS_OFFSET;
  int day_offset;
  int day;
  int month;
  int m;
  int L;
  int k;
  int i;
  int h;
  int g;
  int f;
  int e;
  int d;
  int c;
  int b;
  int a;
  int Y;
  tm *time_info;
  time_t time_data;
  time_t time_data_now;
  int local_68;
  int local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  time(&local_10);
  ptVar3 = localtime(&local_10);
  iVar1 = ptVar3->tm_year + 0x76c;
  iVar2 = iVar1 / 100;
  iVar4 = (((((iVar1 % 0x13) * 0x13 + iVar2) - iVar2 / 4) - ((iVar2 - (iVar2 + 8) / 0x19) + 1) / 3)
          + 0xf) % 0x1e;
  iVar2 = ((((iVar2 % 4) * 2 + 0x20 + ((iVar1 % 100) / 4) * 2) - iVar4) - (iVar1 % 100) % 4) % 7;
  iVar1 = (iVar1 % 0x13 + iVar4 * 0xb + iVar2 * 0x16) / 0x1c3;
  local_68 = -1;
  do {
    if (2 < local_68) {
      local_1c = 0;
LAB_00167f14:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_1c;
      }
      __stack_chk_fail();
    }
    local_18 = local_10 + local_68 * 0x15180;
    ptVar3 = localtime(&local_18);
    if ((ptVar3->tm_mon == (iVar4 + iVar2 + iVar1 * -7 + 0x72) / 0x1f + -1) &&
       (ptVar3->tm_mday == (iVar4 + iVar2 + iVar1 * -7 + 0x72) % 0x1f + 1)) {
      local_1c = 1;
      goto LAB_00167f14;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

int time_iseasterday()
{
	time_t time_data_now, time_data;
	struct tm *time_info;
	int Y, a, b, c, d, e, f, g, h, i, k, L, m, month, day, day_offset;

	time(&time_data_now);
	time_info = localtime(&time_data_now);

	// compute Easter day (Sunday) using https://en.wikipedia.org/w/index.php?title=Computus&oldid=890710285#Anonymous_Gregorian_algorithm
	Y = time_info->tm_year + 1900;
	a = Y % 19;
	b = Y / 100;
	c = Y % 100;
	d = b / 4;
	e = b % 4;
	f = (b + 8) / 25;
	g = (b - f + 1) / 3;
	h = (19 * a + b - d - g + 15) % 30;
	i = c / 4;
	k = c % 4;
	L = (32 + 2 * e + 2 * i - h - k) % 7;
	m = (a + 11 * h + 22 * L) / 451;
	month = (h + L - 7 * m + 114) / 31;
	day = ((h + L - 7 * m + 114) % 31) + 1;

	// (now-1d ≤ easter ≤ now+2d) <=> (easter-2d ≤ now ≤ easter+1d) <=> (Good Friday ≤ now ≤ Easter Monday)
	for(day_offset = -1; day_offset <= 2; day_offset++)
	{
		time_data = time_data_now + day_offset*(60*60*24);
		time_info = localtime(&time_data);

		if(time_info->tm_mon == month-1 && time_info->tm_mday == day)
			return 1;
	}
	return 0;
}